

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void askPassword(arguments *args)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ssize_t sVar5;
  ulong uVar6;
  uint8_t *__dest;
  uint uVar7;
  uint8_t *puVar8;
  uint8_t pw1 [1024];
  uint8_t pw2 [1024];
  
  uVar6 = 0;
  memset(pw1,0,0x400);
  memset(pw2,0,0x400);
  bVar1 = true;
  bVar2 = bVar1;
  while (bVar2) {
    if (!bVar1) {
      puts("Passwords do not match");
    }
    sVar5 = getPassword("Enter password:",pw1,0x400,_stdin);
    puVar8 = pw2;
    uVar6 = getPassword("Confirm password:",pw2,0x400,_stdin);
    uVar7 = (uint)sVar5 & 0xffff;
    uVar3 = (uint)uVar6 & 0xffff;
    if (uVar3 < 6 || uVar7 < 6) {
      puts("Password must be at least 6 characters in length");
      bVar1 = false;
    }
    else if ((uVar7 == uVar3) && (puVar8 = pw2, iVar4 = bcmp(pw1,pw2,uVar6 & 0xffff), iVar4 == 0)) {
      bVar1 = false;
      bVar2 = bVar1;
    }
    else {
      zeroFill(pw1,(uint64_t)puVar8);
      zeroFill(pw2,(uint64_t)puVar8);
      bVar1 = false;
    }
  }
  puts("Password accepted");
  uVar6 = uVar6 & 0xffff;
  __dest = (uint8_t *)calloc(uVar6 + 1,1);
  args->password = __dest;
  puVar8 = pw2;
  memcpy(__dest,pw2,uVar6);
  args->field_0x3c = args->field_0x3c | 2;
  args->pw_length = uVar6;
  zeroFill(pw1,(uint64_t)puVar8);
  zeroFill(pw2,(uint64_t)puVar8);
  return;
}

Assistant:

void askPassword(arguments* args)
{
    bool first = true;
    bool match = false;
    const static uint8_t pw_prompt[] = 
    { 
        'E', 'n', 't', 'e', 'r', ' ', 'p', 'a', 's', 's', 'w', 'o', 'r', 'd', ':', '\0'
    };
    const static uint8_t conf_prompt[] = 
    {
        'C', 'o', 'n', 'f', 'i', 'r', 'm', ' ', 'p', 'a', 's', 's', 'w', 'o', 'r', 'd',
        ':', '\0'
    };

    uint8_t pw1[BUFF_SIZE] = { 0 };
    uint8_t pw2[BUFF_SIZE] = { 0 };
    uint16_t pw1_len = 0;
    uint16_t pw2_len = 0;
 
    while (match == false) //TODO find a portable way to do this
    {
        if (!first) { printf("Passwords do not match\n"); }

        first = false;

        pw1_len = getPassword((uint8_t*)pw_prompt, pw1, BUFF_SIZE, stdin);
        pw2_len = getPassword((uint8_t*)conf_prompt, pw2, BUFF_SIZE, stdin);

        if (pw1_len < 6 || pw2_len < 6) { printf("Password must be at least 6 characters in length\n"); } 
        else if ((pw1_len == pw2_len) && memcmp(pw1, pw2, pw2_len) == 0) { match = true; }
        else //clear buffers from failed pw attempts
        {
            zeroFill(pw1, BUFF_SIZE);
            zeroFill(pw2, BUFF_SIZE);
        }
    }

    printf("Password accepted\n");
    args->password = calloc(pw2_len+1, sizeof(uint8_t));
    memcpy(args->password, pw2, pw2_len);
    args->free = true; //set the flag to free it since we allocated memory for this pw
    args->pw_length = pw2_len; //ad the pw length to the arguments structure

    //zero_fill the temp pw_buffers
    zeroFill(pw1, BUFF_SIZE);
    zeroFill(pw2, BUFF_SIZE);
    pd3("password set to: %s\n", args->password);
}